

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O0

void Gia_ManCollectCis(Gia_Man_t *p,int *pNodes,int nNodes,Vec_Int_t *vSupp)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  int local_34;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vSupp_local;
  int nNodes_local;
  int *pNodes_local;
  Gia_Man_t *p_local;
  
  Vec_IntClear(vSupp);
  Gia_ManIncrementTravId(p);
  pGVar2 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar2);
  for (local_34 = 0; local_34 < nNodes; local_34 = local_34 + 1) {
    pGVar2 = Gia_ManObj(p,pNodes[local_34]);
    iVar1 = Gia_ObjIsCo(pGVar2);
    if (iVar1 == 0) {
      Gia_ManCollectCis_rec(p,pGVar2,vSupp);
    }
    else {
      pGVar2 = Gia_ObjFanin0(pGVar2);
      Gia_ManCollectCis_rec(p,pGVar2,vSupp);
    }
  }
  return;
}

Assistant:

void Gia_ManCollectCis( Gia_Man_t * p, int * pNodes, int nNodes, Vec_Int_t * vSupp )
{
    Gia_Obj_t * pObj;
    int i; 
    Vec_IntClear( vSupp );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    for ( i = 0; i < nNodes; i++ )
    {
        pObj = Gia_ManObj( p, pNodes[i] );
        if ( Gia_ObjIsCo(pObj) )
            Gia_ManCollectCis_rec( p, Gia_ObjFanin0(pObj), vSupp );
        else
            Gia_ManCollectCis_rec( p, pObj, vSupp );
    }
}